

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_text_read::BinTextReader::read_value_visit(BinTextReader *this,List2 *value)

{
  char *pcVar1;
  bool bVar2;
  ulong in_RAX;
  bool end;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  pcVar1 = (this->reader).cur_;
  bVar2 = TextReader::read_nested_begin(&this->reader,(bool *)((long)&uStack_38 + 7));
  if (bVar2) {
    do {
      if (uStack_38._7_1_ != '\0') {
        return true;
      }
      pcVar1 = (this->reader).cur_;
      bVar2 = read_element(this,&value->items,value->valueType);
      if (!bVar2) {
        bVar2 = fail_msg(this,"read_element(value.items, value.valueType)",pcVar1);
        return bVar2;
      }
      pcVar1 = (this->reader).cur_;
      bVar2 = TextReader::read_nested_separator_or_end(&this->reader,(bool *)((long)&uStack_38 + 7))
      ;
    } while (bVar2);
    bVar2 = fail_msg(this,"reader.read_nested_separator_or_end(end)",pcVar1);
  }
  else {
    bVar2 = fail_msg(this,"reader.read_nested_begin(end)",pcVar1);
  }
  return bVar2;
}

Assistant:

bool read_value_visit(List2& value) noexcept {
            bool end = false;
            bin_assert(reader.read_nested_begin(end));
            while (!end) {
                bin_assert(read_element(value.items, value.valueType));
                bin_assert(reader.read_nested_separator_or_end(end));
            }
            return true;
        }